

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::addHangLimitSupport(TranslateToFuzzReader *this)

{
  Const *pCVar1;
  Name name;
  Type local_30;
  char *local_28;
  Type TStack_20;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_18;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> glob;
  TranslateToFuzzReader *this_local;
  
  local_28 = (char *)(this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  TStack_20.id = (uintptr_t)(this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)this;
  Type::Type(&local_30,i32);
  pCVar1 = Builder::makeConst<int>(&this->builder,(this->fuzzParams->super_FuzzParams).HANG_LIMIT);
  name.super_IString.str._M_str = local_28;
  name.super_IString.str._M_len = (size_t)&local_18;
  Builder::makeGlobal(name,TStack_20,(Expression *)local_30.id,(Mutability)pCVar1);
  ::wasm::Module::addGlobal((unique_ptr *)this->wasm);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

void TranslateToFuzzReader::addHangLimitSupport() {
  auto glob =
    builder.makeGlobal(HANG_LIMIT_GLOBAL,
                       Type::i32,
                       builder.makeConst(int32_t(fuzzParams->HANG_LIMIT)),
                       Builder::Mutable);
  wasm.addGlobal(std::move(glob));
}